

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool opj_jp2_encode(opj_jp2_t *jp2,opj_cio_t *cio,opj_image_t *image,
                       opj_codestream_info_t *cstr_info)

{
  int iVar1;
  undefined8 *in_RCX;
  opj_image_t *in_RDX;
  opj_cio_t *in_RSI;
  undefined8 *in_RDI;
  opj_codestream_info_t in_stack_00000000;
  int len_fidx;
  int pos_fidx;
  int end_pos;
  int len_cidx;
  int len_jp2c;
  int pos_jp2c;
  int pos_cidx;
  int pos_iptr;
  opj_cio_t *cio_00;
  opj_cio_t *in_stack_ffffffffffffff50;
  opj_cio_t *cio_01;
  opj_cio_t *in_stack_ffffffffffffff58;
  undefined8 uVar2;
  opj_codestream_info_t *in_stack_ffffffffffffff60;
  undefined8 uVar3;
  opj_image_t *in_stack_ffffffffffffff68;
  opj_cio_t *in_stack_ffffffffffffff70;
  opj_jp2_t *in_stack_ffffffffffffff78;
  opj_jp2_t *in_stack_ffffffffffffff80;
  int local_2c;
  opj_bool local_4;
  
  local_2c = -1;
  jp2_write_jp(in_stack_ffffffffffffff50);
  jp2_write_ftyp((opj_jp2_t *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  jp2_write_jp2h((opj_jp2_t *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  jp2_write_xml(in_stack_ffffffffffffff80,(opj_cio_t *)in_stack_ffffffffffffff78);
  if (*(int *)(in_RDI + 0xc) != 0) {
    local_2c = cio_tell(in_RSI);
    cio_skip(in_RSI,0x18);
    cio_tell(in_RSI);
  }
  iVar1 = jp2_write_jp2c(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if (iVar1 == 0) {
    opj_event_msg((opj_common_ptr)*in_RDI,1,"Failed to encode image\n");
    local_4 = 0;
  }
  else {
    if (*(int *)(in_RDI + 0xc) != 0) {
      cio_tell(in_RSI);
      cio_00 = (opj_cio_t *)*in_RCX;
      cio_01 = (opj_cio_t *)in_RCX[1];
      uVar2 = in_RCX[2];
      uVar3 = in_RCX[3];
      write_cidx((int)((ulong)in_RDI >> 0x20),in_RSI,in_RDX,in_stack_00000000,
                 (int)((ulong)in_RCX >> 0x20));
      cio_tell(in_RSI);
      write_fidx((int)((ulong)uVar3 >> 0x20),(int)uVar3,(int)((ulong)uVar2 >> 0x20),(int)uVar2,
                 cio_01);
      iVar1 = cio_tell(in_RSI);
      cio_seek(in_RSI,local_2c);
      write_iptr((int)((ulong)cio_01 >> 0x20),(int)cio_01,cio_00);
      cio_seek(in_RSI,iVar1);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

opj_bool opj_jp2_encode(opj_jp2_t *jp2, opj_cio_t *cio, opj_image_t *image, opj_codestream_info_t *cstr_info) {

	int pos_iptr, pos_cidx, pos_jp2c, len_jp2c, len_cidx, end_pos, pos_fidx, len_fidx;
	pos_jp2c = pos_iptr = -1; /* remove a warning */

	/* JP2 encoding */

	/* JPEG 2000 Signature box */
	jp2_write_jp(cio);
	/* File Type box */
	jp2_write_ftyp(jp2, cio);
	/* JP2 Header box */
	jp2_write_jp2h(jp2, cio);
	jp2_write_xml(jp2, cio);

	if( jp2->jpip_on){
	  pos_iptr = cio_tell( cio);
	  cio_skip( cio, 24); /* IPTR further ! */
	  
	  pos_jp2c = cio_tell( cio);
	}

	/* J2K encoding */
	if(!(len_jp2c = jp2_write_jp2c( jp2, cio, image, cstr_info))){
	    opj_event_msg(jp2->cinfo, EVT_ERROR, "Failed to encode image\n");
	    return OPJ_FALSE;
	}

	if( jp2->jpip_on){
	  pos_cidx = cio_tell( cio);
	  
	  len_cidx = write_cidx( pos_jp2c+8, cio, image, *cstr_info, len_jp2c-8);
	  
	  pos_fidx = cio_tell( cio);
	  len_fidx = write_fidx( pos_jp2c, len_jp2c, pos_cidx, len_cidx, cio);
	  
	  end_pos = cio_tell( cio);
	  
	  cio_seek( cio, pos_iptr);
	  write_iptr( pos_fidx, len_fidx, cio);
	  	  cio_seek( cio, end_pos);
	}

	return OPJ_TRUE;
}